

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O3

bool __thiscall QNetworkAccessFileBackend::loadFileInfo(QNetworkAccessFileBackend *this)

{
  byte bVar1;
  longlong lVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QFileInfo fi;
  QUrl local_90;
  QArrayData *local_88;
  int local_80;
  QChar local_78;
  QArrayData *local_70 [3];
  undefined1 *local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_58,(QFileDevice *)(this + 0x10));
  QFileInfo::fileTime((FileTime)(QDateTime *)local_70);
  QVariant::QVariant((QVariant *)&local_50,(QDateTime *)local_70);
  QNetworkAccessBackend::setHeader
            ((QNetworkAccessBackend *)this,LastModifiedHeader,(QVariant *)&local_50);
  QVariant::~QVariant((QVariant *)&local_50);
  QDateTime::~QDateTime((QDateTime *)local_70);
  lVar2 = QFileInfo::size();
  QVariant::QVariant((QVariant *)&local_50,lVar2);
  QNetworkAccessBackend::setHeader
            ((QNetworkAccessBackend *)this,ContentLengthHeader,(QVariant *)&local_50);
  QVariant::~QVariant((QVariant *)&local_50);
  QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)this);
  bVar1 = QFileInfo::isDir();
  if (bVar1 != 0) {
    QCoreApplication::translate
              ((char *)local_70,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",0)
    ;
    QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_90);
    QUrl::toString(&local_88,(QNetworkAccessBackend *)&local_90,0);
    QVar3.m_size = (size_t)local_70;
    QVar3.field_0.m_data = &local_50;
    QString::arg_impl(QVar3,local_80,local_78);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)this,ContentOperationNotPermittedError,(QString *)&local_50)
    ;
    if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50.shared = *(int *)local_50.shared + -1;
      UNLOCK();
      if (*(int *)local_50.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    QUrl::~QUrl(&local_90);
    if (local_70[0] != (QArrayData *)0x0) {
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70[0],2,0x10);
      }
    }
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(bVar1 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkAccessFileBackend::loadFileInfo()
{
    QFileInfo fi(file);
    setHeader(QNetworkRequest::LastModifiedHeader, fi.lastModified());
    setHeader(QNetworkRequest::ContentLengthHeader, fi.size());

    // signal we're open
    metaDataChanged();

    if (fi.isDir()) {
        error(QNetworkReply::ContentOperationNotPermittedError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url().toString()));
        finished();
        return false;
    }

    return true;
}